

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::fill(void *src,void *dst,int dstride,int ures,int vres,int pixelsize)

{
  int iVar1;
  long lVar2;
  size_t sVar3;
  
  iVar1 = ures * pixelsize;
  if (iVar1 != 0) {
    sVar3 = 0;
    do {
      memcpy((void *)((long)dst + sVar3),src,(long)pixelsize);
      sVar3 = sVar3 + (long)pixelsize;
    } while ((long)iVar1 != sVar3);
  }
  if (vres * dstride != dstride) {
    lVar2 = (long)dstride;
    do {
      memcpy((void *)((long)dst + lVar2),dst,(long)iVar1);
      lVar2 = lVar2 + dstride;
    } while (vres * dstride != lVar2);
  }
  return;
}

Assistant:

void fill(const void* src, void* dst, int dstride,
          int ures, int vres, int pixelsize)
{
    // fill first row
    int rowlen = ures*pixelsize;
    char* ptr = (char*) dst;
    char* end = ptr + rowlen;
    for (; ptr != end; ptr += pixelsize) memcpy(ptr, src, pixelsize);

    // fill remaining rows from first row
    ptr = (char*) dst + dstride;
    end = (char*) dst + vres*dstride;
    for (; ptr != end; ptr += dstride) memcpy(ptr, dst, rowlen);
}